

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsGetOwnPropertyDescriptorCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          JsValueRef *propertyDescriptor)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  undefined7 extraout_var;
  undefined1 local_60 [8];
  PropertyDescriptor propertyDescriptorValue;
  
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x641,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) goto LAB_00379867;
    *puVar5 = 0;
  }
  Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
  pRVar6 = Js::VarTo<Js::RecyclableObject>(object);
  BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                    (pRVar6,propertyRecord->pid,scriptContext,(PropertyDescriptor *)local_60);
  if (BVar3 == 0) {
    pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar6 = (RecyclableObject *)
             Js::JavascriptOperators::FromPropertyDescriptor
                       ((PropertyDescriptor *)local_60,scriptContext);
  }
  *propertyDescriptor = pRVar6;
  if (pRVar6 != (RecyclableObject *)0x0) {
    uVar4 = Js::CrossSite::NeedMarshalVar(pRVar6,scriptContext);
    pRVar6 = (RecyclableObject *)(ulong)uVar4;
    if (uVar4 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x64d,
                         "(*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext))"
                         ,
                         "*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext)"
                        );
      pRVar6 = (RecyclableObject *)CONCAT71(extraout_var,bVar2);
      if (!bVar2) {
LAB_00379867:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return (JsErrorCode)pRVar6;
}

Assistant:

static JsErrorCode JsGetOwnPropertyDescriptorCommon(Js::ScriptContext * scriptContext,
    _In_ JsValueRef object, _In_ const Js::PropertyRecord * propertyRecord, _Out_ JsValueRef *propertyDescriptor)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    Js::PropertyDescriptor propertyDescriptorValue;
    if (Js::JavascriptOperators::GetOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(object),
        propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptorValue))
    {
        *propertyDescriptor = Js::JavascriptOperators::FromPropertyDescriptor(propertyDescriptorValue, scriptContext);
    }
    else
    {
        *propertyDescriptor = scriptContext->GetLibrary()->GetUndefined();
    }
    Assert(*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext));

    return JsNoError;
}